

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O3

Own<const_kj::Directory,_std::nullptr_t> __thiscall
kj::anon_unknown_59::InMemoryDirectory::Impl::copyDirectory
          (Impl *this,Directory *other,bool copyFiles)

{
  InMemoryFileFactory *pIVar1;
  _func_int **pp_Var2;
  _func_int **pp_Var3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  char *pcVar7;
  String *pSVar8;
  Fault FVar9;
  InMemoryFileFactory *pIVar10;
  undefined8 uVar11;
  Type in_ECX;
  Type code;
  _Base_ptr p_Var12;
  _Base_ptr p_Var13;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int iVar14;
  undefined7 in_register_00000011;
  Directory *extraout_RDX;
  Directory *extraout_RDX_00;
  Directory *extraout_RDX_01;
  Directory *pDVar15;
  Directory *extraout_RDX_02;
  Exception *pEVar16;
  Disposer *disposerCopy;
  char *in_R8;
  _Base_ptr p_Var17;
  code *in_R9;
  long *plVar18;
  long lVar19;
  size_t *name;
  long lVar20;
  bool bVar21;
  Own<const_kj::Directory,_std::nullptr_t> OVar22;
  __enable_if_t<is_constructible<value_type,_pair<StringPtr,_EntryImpl>_>::value,_pair<iterator,_bool>_>
  _Var23;
  Own<const_kj::File,_std::nullptr_t> copy;
  Path filename;
  EntryImpl entry;
  DebugExpression<bool> _kjCondition_1;
  OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
  newNode;
  DebugComparison<kj::OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>_&,_std::nullptr_t>
  *in_stack_fffffffffffffe68;
  undefined1 local_188 [16];
  char *local_178;
  undefined4 uStack_170;
  undefined4 uStack_16c;
  bool local_168;
  undefined7 uStack_167;
  OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
  local_160;
  InMemoryFileFactory *local_138;
  Type local_12c;
  Path local_128;
  Fault local_108;
  _Base_ptr p_Stack_100;
  _Base_ptr p_Stack_f8;
  OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
  OStack_f0;
  long *local_c8;
  Clock *local_c0;
  long local_b8;
  long lStack_b0;
  undefined8 *local_a8;
  Mutex *local_98;
  Impl *local_90;
  InMemoryFileFactory *local_88;
  InMemoryFileFactory *local_80;
  _Base_ptr local_78;
  undefined8 local_70;
  undefined8 uStack_68;
  _Base_ptr local_60;
  uint local_58;
  
  local_c8 = (long *)CONCAT71(in_register_00000011,copyFiles);
  pp_Var2 = (other->super_ReadableDirectory).super_FsNode._vptr_FsNode;
  pp_Var3 = other[1].super_ReadableDirectory.super_FsNode._vptr_FsNode;
  local_12c = in_ECX;
  local_90 = this;
  pIVar10 = (InMemoryFileFactory *)operator_new(0x78);
  local_c0 = (Clock *)(pIVar10 + 8);
  *(undefined4 *)(pIVar10 + 0x10) = 0;
  *(undefined ***)pIVar10 = &PTR_getFd_006e3fe0;
  *(undefined **)(pIVar10 + 8) = &DAT_006e40b8;
  local_138 = pIVar10;
  kj::_::Mutex::Mutex((Mutex *)(pIVar10 + 0x18));
  *(_func_int ***)(pIVar10 + 0x30) = pp_Var2;
  *(_func_int ***)(pIVar10 + 0x38) = pp_Var3;
  *(undefined4 *)(pIVar10 + 0x48) = 0;
  *(undefined8 *)(pIVar10 + 0x50) = 0;
  *(InMemoryFileFactory **)(pIVar10 + 0x58) = pIVar10 + 0x48;
  *(InMemoryFileFactory **)(pIVar10 + 0x60) = pIVar10 + 0x48;
  *(undefined8 *)(pIVar10 + 0x68) = 0;
  local_98 = (Mutex *)(pIVar10 + 0x18);
  uVar11 = (**(code **)*pp_Var2)(pp_Var2);
  plVar18 = local_c8;
  *(undefined8 *)(pIVar10 + 0x70) = uVar11;
  (**(code **)(*local_c8 + 0x38))(&local_b8,local_c8);
  pDVar15 = extraout_RDX;
  lVar20 = local_b8;
  if (lStack_b0 != 0) {
    local_88 = local_138 + 0x30;
    local_80 = local_138 + 0x40;
    name = (size_t *)(local_b8 + 8);
    lVar19 = lStack_b0 << 5;
    do {
      Path::Path(&local_128,(String *)name);
      local_58 = 0;
      iVar14 = *(int *)(name + -1);
      if (iVar14 == 0) {
        in_R8 = (char *)0x2;
        p_Var13 = (_Base_ptr)local_128.parts.size_;
        (**(code **)(*plVar18 + 0x68))((Impl *)local_188,plVar18,local_128.parts.ptr);
        uVar5 = local_188._8_8_;
        uVar11 = local_188._0_8_;
        code = (Type)p_Var13;
        if ((_Base_ptr)local_188._8_8_ != (_Base_ptr)0x0) {
          pEVar16 = (Exception *)local_188._0_8_;
          if ((undefined1)local_12c != '\0') {
            (**(code **)**(undefined8 **)(local_138 + 0x38))
                      ((Impl *)local_188,*(undefined8 **)(local_138 + 0x38),
                       *(undefined8 *)(local_138 + 0x30));
            code = FAILED;
            in_R8 = (char *)0xffffffffffffffff;
            (*(*(_func_int ***)local_188._8_8_)[0xd])(local_188._8_8_,0,uVar5);
            uVar4 = local_188._8_8_;
            pEVar16 = (Exception *)local_188._0_8_;
            local_188._8_8_ = (InMemoryFileFactory *)0x0;
            (**(_func_int **)(((String *)uVar11)->content).ptr)
                      (uVar11,(*(_func_int ***)uVar5)[-2] + uVar5);
            uVar11 = local_188._8_8_;
            bVar21 = (InMemoryFileFactory *)local_188._8_8_ != (InMemoryFileFactory *)0x0;
            local_188._8_8_ = uVar4;
            if (bVar21) {
              local_188._8_8_ = (InMemoryFileFactory *)0x0;
              (**(_func_int **)(((String *)local_188._0_8_)->content).ptr)
                        (local_188._0_8_,
                         (InMemoryFileFactory *)(uVar11 + *(long *)(*(long *)uVar11 + -0x10)));
              local_188._8_8_ = uVar4;
            }
          }
          local_188._0_4_ = 1;
          local_178 = (char *)local_188._8_8_;
          local_188._8_8_ = pEVar16;
          OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
          ::operator=((OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
                       *)&stack0xffffffffffffffa8,
                      (OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
                       *)local_188);
          OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
          ::destroy((OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
                     *)local_188);
          plVar18 = local_c8;
          iVar14 = extraout_EDX_01;
LAB_004c8509:
          local_188._0_8_ = &stack0xffffffffffffffa8;
          local_188._8_8_ = (InMemoryFileFactory *)0x0;
          local_178 = " != ";
          _uStack_170 = 5;
          local_168 = local_58 != 0;
          if (local_58 == 0) {
            kj::_::Debug::Fault::
            Fault<kj::Exception::Type,kj::_::DebugComparison<kj::OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>&,decltype(nullptr)>&>
                      (&local_108,local_188,iVar14,code,in_R8,(char *)in_R9,
                       in_stack_fffffffffffffe68);
            kj::_::Debug::Fault::fatal(&local_108);
          }
          pEVar16 = (Exception *)((local_128.parts.ptr)->content).ptr;
          p_Var13 = (_Base_ptr)((local_128.parts.ptr)->content).size_;
          p_Stack_f8 = (_Base_ptr)((local_128.parts.ptr)->content).disposer;
          ((local_128.parts.ptr)->content).ptr = (char *)0x0;
          ((local_128.parts.ptr)->content).size_ = 0;
          OStack_f0.tag = _S_red;
          local_108.exception = pEVar16;
          p_Stack_100 = p_Var13;
          OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
          ::operator=(&OStack_f0,
                      (OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
                       *)local_188._0_8_);
          local_188._8_8_ = (long)p_Var13 + 0x68 + ((ulong)(p_Var13 == (_Base_ptr)0x0) - 0x68);
          if (p_Var13 == (_Base_ptr)0x0) {
            pEVar16 = (Exception *)0x524569;
          }
          local_178 = (char *)local_108.exception;
          _uStack_170 = p_Stack_100;
          _local_168 = p_Stack_f8;
          local_108.exception = (Exception *)0x0;
          p_Stack_100 = (_Base_ptr)0x0;
          local_160.tag = OStack_f0.tag;
          if (OStack_f0.tag == 3) {
            local_160.field_1._0_8_ = OStack_f0.field_1._0_8_;
            local_160.field_1._8_8_ = OStack_f0.field_1._8_8_;
            local_160.field_1._16_4_ = OStack_f0.field_1._16_4_;
            local_160.field_1._20_4_ = OStack_f0.field_1._20_4_;
            local_160.field_1._24_4_ = OStack_f0.field_1._24_4_;
            local_160.field_1._28_4_ = OStack_f0.field_1._28_4_;
            OStack_f0.field_1._8_8_ = 0;
            OStack_f0.field_1._16_8_ = 0;
          }
          else if ((OStack_f0.tag == 2) || (OStack_f0.tag == _S_black)) {
            local_160.field_1._0_8_ = OStack_f0.field_1._0_8_;
            local_160.field_1._8_8_ = OStack_f0.field_1._8_8_;
            OStack_f0.field_1._8_8_ = 0;
          }
          local_188._0_8_ = pEVar16;
          _Var23 = std::
                   map<kj::StringPtr,kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl,std::less<kj::StringPtr>,std::allocator<std::pair<kj::StringPtr_const,kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>>>
                   ::
                   insert<std::pair<kj::StringPtr,kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>>
                             ((map<kj::StringPtr,kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl,std::less<kj::StringPtr>,std::allocator<std::pair<kj::StringPtr_const,kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>>>
                               *)local_80,
                              (pair<kj::StringPtr,_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>
                               *)local_188);
          local_78 = (_Base_ptr)CONCAT71(local_78._1_7_,_Var23.second);
          OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
          ::destroy(&local_160);
          uVar11 = _uStack_170;
          pcVar7 = local_178;
          if ((_Base_ptr)local_178 != (_Base_ptr)0x0) {
            local_178 = (char *)0x0;
            _uStack_170 = (_Base_ptr)0x0;
            in_R9 = (code *)0x0;
            (***(_func_int ***)_local_168)(_local_168,pcVar7,1);
            in_R8 = (char *)uVar11;
          }
          if (((undefined1  [16])_Var23 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
                      ((Fault *)local_188,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                       ,0x63c,FAILED,"entries.insert(std::make_pair(nameRef, kj::mv(entry))).second"
                       ,"_kjCondition,",(DebugExpression<bool> *)&local_78);
            kj::_::Debug::Fault::fatal((Fault *)local_188);
          }
          OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
          ::destroy(&OStack_f0);
          p_Var13 = p_Stack_100;
          FVar9.exception = local_108.exception;
          if (local_108.exception != (Exception *)0x0) {
            local_108.exception = (Exception *)0x0;
            p_Stack_100 = (_Base_ptr)0x0;
            in_R9 = (code *)0x0;
            (***(_func_int ***)&p_Stack_f8->_M_color)(p_Stack_f8,FVar9.exception,1);
            in_R8 = (char *)p_Var13;
          }
        }
      }
      else if (iVar14 == 1) {
        in_R8 = (char *)0x2;
        (**(code **)(*plVar18 + 0x88))
                  ((Impl *)local_188,plVar18,local_128.parts.ptr,local_128.parts.size_);
        uVar5 = local_188._8_8_;
        uVar11 = local_188._0_8_;
        if ((_Base_ptr)local_188._8_8_ != (_Base_ptr)0x0) {
          code = local_12c & 0xff;
          OVar22 = copyDirectory((Impl *)local_188,(Directory *)local_88,SUB81(local_188._8_8_,0));
          uVar6 = local_188._8_8_;
          uVar4 = local_188._0_8_;
          (**(_func_int **)(((String *)uVar11)->content).ptr)
                    (uVar11,(*(_func_int ***)uVar5)[-2] + uVar5,OVar22.ptr);
          local_188._0_4_ = 2;
          local_188._8_8_ = uVar4;
          local_178 = (char *)uVar6;
          OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
          ::operator=((OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
                       *)&stack0xffffffffffffffa8,
                      (OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
                       *)local_188);
          OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
          ::destroy((OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
                     *)local_188);
          plVar18 = local_c8;
          iVar14 = extraout_EDX_00;
          goto LAB_004c8509;
        }
      }
      else if (iVar14 == 2) {
        (**(code **)(*plVar18 + 0x60))
                  ((Impl *)local_188,plVar18,local_128.parts.ptr,local_128.parts.size_);
        local_108.exception._0_1_ = local_188[0];
        if (local_188[0] == '\x01') {
          p_Stack_100 = (_Base_ptr)local_188._8_8_;
          p_Stack_f8 = (_Base_ptr)local_178;
          OStack_f0.tag = uStack_170;
          OStack_f0._4_4_ = uStack_16c;
          (**(code **)(*plVar18 + 0x48))
                    ((Impl *)local_188,plVar18,local_128.parts.ptr,local_128.parts.size_);
          p_Var17 = p_Stack_f8;
          p_Var13 = p_Stack_100;
          if (local_188[0] == '\x01') {
            local_78 = (_Base_ptr)_local_168;
            p_Var12 = (_Base_ptr)CONCAT44(OStack_f0._4_4_,OStack_f0.tag);
            p_Stack_100 = (_Base_ptr)0x0;
            p_Stack_f8 = (_Base_ptr)0x0;
            local_188._0_4_ = 3;
            local_188._8_8_ = _local_168;
            local_178 = (char *)p_Var13;
            _uStack_170 = p_Var17;
            local_70 = 0;
            uStack_68 = 0;
            _local_168 = p_Var12;
            local_60 = p_Var12;
            OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
            ::operator=((OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
                         *)&stack0xffffffffffffffa8,
                        (OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
                         *)local_188);
            code = (Type)p_Var12;
            OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
            ::destroy((OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
                       *)local_188);
            iVar14 = extraout_EDX;
            goto LAB_004c8509;
          }
          if (p_Stack_100 != (_Base_ptr)0x0) {
            p_Stack_100 = (_Base_ptr)0x0;
            p_Stack_f8 = (_Base_ptr)0x0;
            in_R9 = (code *)0x0;
            (*(code *)**(undefined8 **)CONCAT44(OStack_f0._4_4_,OStack_f0.tag))
                      ((undefined8 *)CONCAT44(OStack_f0._4_4_,OStack_f0.tag),p_Var13,1);
            in_R8 = (char *)p_Var17;
          }
        }
      }
      else if (kj::_::Debug::minSeverity < 3) {
        in_R8 = "couldn\'t copy node of type not supported by InMemoryDirectory";
        in_R9 = (code *)&local_128;
        kj::_::Debug::log<char_const(&)[62],kj::Path&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                   ,0x633,ERROR,
                   "\"couldn\'t copy node of type not supported by InMemoryDirectory\", filename",
                   (char (*) [62])"couldn\'t copy node of type not supported by InMemoryDirectory",
                   (Path *)in_R9);
      }
      OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
      ::destroy((OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
                 *)&stack0xffffffffffffffa8);
      p_Var13 = (_Base_ptr)local_128.parts.size_;
      pSVar8 = local_128.parts.ptr;
      pDVar15 = extraout_RDX_00;
      if (local_128.parts.ptr != (String *)0x0) {
        local_128.parts.ptr = (String *)0x0;
        local_128.parts.size_ = 0;
        in_R9 = ArrayDisposer::Dispose_<kj::String>::destruct;
        (**(local_128.parts.disposer)->_vptr_ArrayDisposer)(local_128.parts.disposer,pSVar8,0x18);
        pDVar15 = extraout_RDX_01;
        in_R8 = (char *)p_Var13;
      }
      name = name + 4;
      lVar19 = lVar19 + -0x20;
      lVar20 = local_b8;
    } while (lVar19 != 0);
  }
  lVar19 = lStack_b0;
  pIVar10 = local_138;
  if (lVar20 != 0) {
    local_b8 = 0;
    lStack_b0 = 0;
    (**(code **)*local_a8)
              (local_a8,lVar20,0x20,lVar19,lVar19,
               ArrayDisposer::Dispose_<kj::ReadableDirectory::Entry>::destruct);
    pDVar15 = extraout_RDX_02;
  }
  LOCK();
  pIVar1 = pIVar10 + 0x10;
  *(int *)pIVar1 = *(int *)pIVar1 + 1;
  UNLOCK();
  local_90->clock = local_c0;
  local_90->fileFactory = pIVar10;
  OVar22.ptr = pDVar15;
  OVar22.disposer = (Disposer *)local_c0;
  return OVar22;
}

Assistant:

Own<const Directory> copyDirectory(const Directory& other, bool copyFiles) const {
      // Creates an in-memory deep copy of the given directory object. If `copyFiles` is true, then
      // file contents are copied too, otherwise they are just linked.
      return kj::atomicRefcounted<InMemoryDirectory>(clock, fileFactory, other, copyFiles);
    }